

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__pnm_skip_whitespace(stbi__context *s,char *c)

{
  stbi_uc *psVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi_uc *psVar4;
  
  psVar1 = s->buffer_start;
  do {
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00117d77:
      if (s->img_buffer_end <= s->img_buffer) {
        return;
      }
    }
    else {
      iVar3 = (*(s->io).eof)(s->io_user_data);
      if (iVar3 != 0) {
        if (s->read_from_callbacks == 0) {
          return;
        }
        goto LAB_00117d77;
      }
    }
    if ((4 < (byte)*c - 9) && (*c != 0x20)) {
      return;
    }
    psVar4 = s->img_buffer;
    if (psVar4 < s->img_buffer_end) {
      s->img_buffer = psVar4 + 1;
      sVar2 = *psVar4;
    }
    else if (s->read_from_callbacks == 0) {
      sVar2 = '\0';
    }
    else {
      iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
      if (iVar3 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        sVar2 = '\0';
        psVar4 = s->buffer_start + 1;
      }
      else {
        sVar2 = *psVar1;
        psVar4 = psVar1 + iVar3;
      }
      s->img_buffer_end = psVar4;
      s->img_buffer = s->buffer_start + 1;
    }
    *c = sVar2;
  } while( true );
}

Assistant:

static void     stbi__pnm_skip_whitespace(stbi__context *s, char *c)
{
   while (!stbi__at_eof(s) && stbi__pnm_isspace(*c))
      *c = (char) stbi__get8(s);
}